

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void idwpt_sym(wpt_object wt,double *cA,int len_cA,double *cD,double *X)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_4c;
  int v;
  int t;
  int n;
  int m;
  int l;
  int i;
  int len_avg;
  double *X_local;
  double *cD_local;
  int len_cA_local;
  double *cA_local;
  wpt_object wt_local;
  
  iVar1 = wt->wave->lpr_len;
  iVar2 = wt->wave->hpr_len;
  t = -2;
  v = -1;
  for (local_4c = 0; local_4c < len_cA; local_4c = local_4c + 1) {
    t = t + 2;
    v = v + 2;
    X[t] = 0.0;
    X[v] = 0.0;
    for (n = 0; n < (iVar1 + iVar2) / 4; n = n + 1) {
      iVar3 = n * 2;
      if ((-1 < local_4c - n) && (local_4c - n < len_cA)) {
        X[t] = wt->wave->lpr[iVar3] * cA[local_4c - n] + wt->wave->hpr[iVar3] * cD[local_4c - n] +
               X[t];
        X[v] = wt->wave->lpr[iVar3 + 1] * cA[local_4c - n] +
               wt->wave->hpr[iVar3 + 1] * cD[local_4c - n] + X[v];
      }
    }
  }
  return;
}

Assistant:

static void idwpt_sym(wpt_object wt, double *cA, int len_cA, double *cD, double *X) {
	int len_avg, i, l, m, n, t, v;

	len_avg = (wt->wave->lpr_len + wt->wave->hpr_len) / 2;
	m = -2;
	n = -1;

	for (v = 0; v < len_cA; ++v) {
		i = v;
		m += 2;
		n += 2;
		X[m] = 0.0;
		X[n] = 0.0;
		for (l = 0; l < len_avg / 2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				X[m] += wt->wave->lpr[t] * cA[i - l] + wt->wave->hpr[t] * cD[i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l] + wt->wave->hpr[t + 1] * cD[i - l];
			}
		}
	}
}